

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

bool testing::internal::anon_unknown_88::IsValidUTF8(char *str,size_t length)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uStack_30;
  uchar lead;
  size_t i;
  uchar *s;
  size_t length_local;
  char *str_local;
  
  uStack_30 = 0;
  uVar3 = uStack_30;
  while( true ) {
    do {
      uStack_30 = uVar3;
      if (length <= uStack_30) {
        return true;
      }
      uVar3 = uStack_30 + 1;
      bVar1 = str[uStack_30];
    } while (bVar1 < 0x80);
    if (bVar1 < 0xc2) break;
    if (((bVar1 < 0xe0) && (uStack_30 + 2 <= length)) &&
       (bVar2 = IsUTF8TrailByte(str[uVar3]), bVar2)) {
      uVar3 = uStack_30 + 2;
    }
    else if (((((bVar1 < 0xe0) || (0xef < bVar1)) ||
              ((length < uStack_30 + 3 ||
               ((bVar2 = IsUTF8TrailByte(str[uVar3]), !bVar2 ||
                (bVar2 = IsUTF8TrailByte(str[uStack_30 + 2]), !bVar2)))))) ||
             ((bVar1 == 0xe0 && ((byte)str[uVar3] < 0xa0)))) ||
            ((bVar1 == 0xed && (0x9f < (byte)str[uVar3])))) {
      if ((((bVar1 < 0xf0) ||
           ((((0xf4 < bVar1 || (length < uStack_30 + 4)) ||
             (bVar2 = IsUTF8TrailByte(str[uVar3]), !bVar2)) ||
            ((bVar2 = IsUTF8TrailByte(str[uStack_30 + 2]), !bVar2 ||
             (bVar2 = IsUTF8TrailByte(str[uStack_30 + 3]), !bVar2)))))) ||
          ((bVar1 == 0xf0 && ((byte)str[uVar3] < 0x90)))) ||
         ((bVar1 == 0xf4 && (0x8f < (byte)str[uVar3])))) {
        return false;
      }
      uVar3 = uStack_30 + 4;
    }
    else {
      uVar3 = uStack_30 + 3;
    }
  }
  return false;
}

Assistant:

bool IsValidUTF8(const char* str, size_t length) {
  const unsigned char *s = reinterpret_cast<const unsigned char *>(str);

  for (size_t i = 0; i < length;) {
    unsigned char lead = s[i++];

    if (lead <= 0x7f) {
      continue;  // single-byte character (ASCII) 0..7F
    }
    if (lead < 0xc2) {
      return false;  // trail byte or non-shortest form
    } else if (lead <= 0xdf && (i + 1) <= length && IsUTF8TrailByte(s[i])) {
      ++i;  // 2-byte character
    } else if (0xe0 <= lead && lead <= 0xef && (i + 2) <= length &&
               IsUTF8TrailByte(s[i]) &&
               IsUTF8TrailByte(s[i + 1]) &&
               // check for non-shortest form and surrogate
               (lead != 0xe0 || s[i] >= 0xa0) &&
               (lead != 0xed || s[i] < 0xa0)) {
      i += 2;  // 3-byte character
    } else if (0xf0 <= lead && lead <= 0xf4 && (i + 3) <= length &&
               IsUTF8TrailByte(s[i]) &&
               IsUTF8TrailByte(s[i + 1]) &&
               IsUTF8TrailByte(s[i + 2]) &&
               // check for non-shortest form
               (lead != 0xf0 || s[i] >= 0x90) &&
               (lead != 0xf4 || s[i] < 0x90)) {
      i += 3;  // 4-byte character
    } else {
      return false;
    }
  }
  return true;
}